

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O0

Test * __thiscall
testing::internal::
TestFactoryImpl<bssl::gtest_suite_CertIssuerSourceSyncNormalizationTest_::MultipleMatchesAfterNormalization<bssl::(anonymous_namespace)::CertIssuerSourceStaticTestDelegate>_>
::CreateTest(TestFactoryImpl<bssl::gtest_suite_CertIssuerSourceSyncNormalizationTest_::MultipleMatchesAfterNormalization<bssl::(anonymous_namespace)::CertIssuerSourceStaticTestDelegate>_>
             *this)

{
  Test *this_00;
  TestFactoryImpl<bssl::gtest_suite_CertIssuerSourceSyncNormalizationTest_::MultipleMatchesAfterNormalization<bssl::(anonymous_namespace)::CertIssuerSourceStaticTestDelegate>_>
  *this_local;
  
  this_00 = (Test *)operator_new(0x100);
  bssl::gtest_suite_CertIssuerSourceSyncNormalizationTest_::
  MultipleMatchesAfterNormalization<bssl::(anonymous_namespace)::CertIssuerSourceStaticTestDelegate>
  ::MultipleMatchesAfterNormalization
            ((MultipleMatchesAfterNormalization<bssl::(anonymous_namespace)::CertIssuerSourceStaticTestDelegate>
              *)this_00);
  return this_00;
}

Assistant:

Test* CreateTest() override { return new TestClass; }